

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

HelicsBroker helicsCreateBrokerFromArgs(char *type,char *name,int argc,char **argv,HelicsError *err)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  string_view type_00;
  size_type sVar1;
  CoreType CVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  char **__args;
  _Alloc_hider _Var6;
  int iVar7;
  string_view brokerName;
  string_view newError;
  __single_object broker;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char *in_stack_ffffffffffffff38;
  _Head_base<0UL,_helics::BrokerObject_*,_false> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [24];
  undefined8 uStack_60;
  MasterObjectHolder *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (type == (char *)0x0) {
      CVar2 = DEFAULT;
    }
    else {
      strlen(type);
      type_00._M_str = in_stack_ffffffffffffff38;
      type_00._M_len = 0x198e2d;
      CVar2 = helics::core::coreTypeFromString(type_00);
    }
    if (CVar2 != UNRECOGNIZED) {
      local_98._M_dataplus._M_p = (pointer)operator_new(0x18);
      (((BrokerObject *)local_98._M_dataplus._M_p)->brokerptr).
      super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      (((BrokerObject *)local_98._M_dataplus._M_p)->brokerptr).
      super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ((BrokerObject *)local_98._M_dataplus._M_p)->index = -2;
      ((BrokerObject *)local_98._M_dataplus._M_p)->valid = 0;
      ((BrokerObject *)local_98._M_dataplus._M_p)->valid = -0x5cb982e0;
      local_78._0_8_ = (pointer)0x0;
      local_78._8_8_ = (pointer)0x0;
      local_78._16_8_ = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78,(long)argc - 1);
      __args = argv + (uint)argc;
      iVar7 = argc + 1;
      while( true ) {
        __args = __args + -1;
        iVar7 = iVar7 + -1;
        if (iVar7 < 2) break;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*const&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_78,
                   __args);
      }
      _Var6._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
      pcVar4 = (char *)gHelicsEmptyStr_abi_cxx11_._M_string_length;
      if (name != (char *)0x0) {
        pcVar4 = (char *)strlen(name);
        _Var6._M_p = name;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_48,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_78);
      brokerName._M_len = (ulong)CVar2;
      brokerName._M_str = pcVar4;
      helics::BrokerFactory::create
                ((CoreType)&local_b8,brokerName,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)_Var6._M_p);
      sVar1 = local_b8._M_string_length;
      _Var6._M_p = local_b8._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      this = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._M_dataplus._M_p + 8))->_M_pi;
      *(pointer *)local_98._M_dataplus._M_p = _Var6._M_p;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98._M_dataplus._M_p + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar1;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      _Var6._M_p = local_98._M_dataplus._M_p;
      getMasterHolder();
      local_c0._M_head_impl = (BrokerObject *)local_98._M_dataplus._M_p;
      local_98._M_dataplus._M_p = (pointer)0x0;
      MasterObjectHolder::addBroker
                ((MasterObjectHolder *)local_b8._M_dataplus._M_p,
                 (unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
                 &local_c0);
      if (local_c0._M_head_impl != (BrokerObject *)0x0) {
        std::default_delete<helics::BrokerObject>::operator()
                  ((default_delete<helics::BrokerObject> *)&local_c0,local_c0._M_head_impl);
      }
      local_c0._M_head_impl = (BrokerObject *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._M_string_length);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_78);
      if ((BrokerObject *)local_98._M_dataplus._M_p == (BrokerObject *)0x0) {
        return (BrokerObject *)_Var6._M_p;
      }
      std::default_delete<helics::BrokerObject>::operator()
                ((default_delete<helics::BrokerObject> *)&local_98,
                 (BrokerObject *)local_98._M_dataplus._M_p);
      return (BrokerObject *)_Var6._M_p;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -4;
      getMasterHolder();
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"core type ","");
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_98,type);
      local_b8._M_dataplus._M_p = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p == paVar5) {
        local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_b8.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      }
      else {
        local_b8.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      }
      local_b8._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b8," is not recognized");
      local_78._0_8_ = (pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._0_8_ == paVar5) {
        local_78._16_8_ = paVar5->_M_allocated_capacity;
        uStack_60 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_78._0_8_ = (pointer)(local_78 + 0x10);
      }
      else {
        local_78._16_8_ = paVar5->_M_allocated_capacity;
      }
      local_78._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      newError._M_str = (char *)local_78._0_8_;
      newError._M_len = local_78._8_8_;
      pcVar4 = MasterObjectHolder::addErrorString(local_58,newError);
      err->message = pcVar4;
      if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,
                        (ulong)((long)&((_Alloc_hider *)local_78._16_8_)->_M_p + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
    }
  }
  return (HelicsBroker)0x0;
}

Assistant:

HelicsBroker helicsCreateBrokerFromArgs(const char* type, const char* name, int argc, const char* const* argv, HelicsError* err)
{
    if ((err != nullptr) && (err->error_code != 0)) {
        return nullptr;
    }
    const helics::CoreType coretype = (type != nullptr) ? helics::core::coreTypeFromString(type) : helics::CoreType::DEFAULT;

    if (coretype == helics::CoreType::UNRECOGNIZED) {
        if (err != nullptr) {
            err->error_code = HELICS_ERROR_INVALID_ARGUMENT;
            err->message = getMasterHolder()->addErrorString(std::string("core type ") + type + " is not recognized");
        }
        return nullptr;
    }
    auto broker = std::make_unique<helics::BrokerObject>();
    broker->valid = gBrokerValidationIdentifier;
    try {
        std::vector<std::string> args;
        args.reserve(static_cast<size_t>(argc) - 1);
        for (int ii = argc - 1; ii > 0; ii--) {
            args.emplace_back(argv[ii]);
        }
        broker->brokerptr = helics::BrokerFactory::create(coretype, AS_STRING_VIEW(name), args);
        auto* retbroker = reinterpret_cast<HelicsBroker>(broker.get());
        getMasterHolder()->addBroker(std::move(broker));
        return retbroker;
    }
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
}